

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O1

vector<QPDFExc,_std::allocator<QPDFExc>_> * __thiscall
QPDF::getWarnings(vector<QPDFExc,_std::allocator<QPDFExc>_> *__return_storage_ptr__,QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  pointer pQVar2;
  pointer pQVar3;
  pointer pQVar4;
  
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::vector
            (__return_storage_ptr__,
             &((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->warnings);
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  pQVar2 = *(pointer *)
            &((_Var1._M_head_impl)->warnings).super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>;
  pQVar3 = *(pointer *)((long)&(_Var1._M_head_impl)->warnings + 8);
  pQVar4 = pQVar2;
  if (pQVar3 != pQVar2) {
    do {
      (*(code *)**(undefined8 **)pQVar4)(pQVar4);
      pQVar4 = pQVar4 + 1;
    } while (pQVar4 != pQVar3);
    *(pointer *)((long)&(_Var1._M_head_impl)->warnings + 8) = pQVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFExc>
QPDF::getWarnings()
{
    std::vector<QPDFExc> result = m->warnings;
    m->warnings.clear();
    return result;
}